

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolj.c
# Opt level: O0

int ffpprjj(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,LONGLONG *array,int *status)

{
  int iVar1;
  int *in_R9;
  long row;
  LONGLONG *in_stack_00007230;
  LONGLONG in_stack_00007238;
  LONGLONG in_stack_00007240;
  LONGLONG in_stack_00007248;
  int in_stack_00007254;
  fitsfile *in_stack_00007258;
  int *in_stack_000072a0;
  fitsfile *in_stack_ffffffffffffffa8;
  int local_4;
  
  iVar1 = fits_is_compressed_image(in_stack_ffffffffffffffa8,(int *)0x218d41);
  if (iVar1 == 0) {
    ffpcljj(in_stack_00007258,in_stack_00007254,in_stack_00007248,in_stack_00007240,
            in_stack_00007238,in_stack_00007230,in_stack_000072a0);
    local_4 = *in_R9;
  }
  else {
    ffpmsg((char *)0x218d52);
    *in_R9 = 0x19d;
    local_4 = 0x19d;
  }
  return local_4;
}

Assistant:

int ffpprjj(fitsfile *fptr,  /* I - FITS file pointer                       */
            long  group,     /* I - group to write(1 = 1st group)           */
            LONGLONG  firstelem, /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,     /* I - number of values to write               */
            LONGLONG  *array, /* I - array of values that are written       */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).
*/
{
    long row;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        ffpmsg("writing TLONGLONG to compressed image is not supported");

        return(*status = DATA_COMPRESSION_ERR);
    }

    row=maxvalue(1,group);

    ffpcljj(fptr, 2, row, firstelem, nelem, array, status);
    return(*status);
}